

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall AnalogConsumer::~AnalogConsumer(AnalogConsumer *this)

{
  HFParsingInfo *in_RDI;
  vector<short,_std::allocator<short>_> *unaff_retaddr;
  
  (in_RDI->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__AnalogConsumer_00375228;
  HFParsingInfo::~HFParsingInfo(in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<short,_std::allocator<short>_>::~vector(unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

AnalogConsumer::~AnalogConsumer(){

}